

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

uint gl4cts::TextureViewUtilities::getTextureDataSize
               (GLenum internalformat,GLenum type,uint width,uint height)

{
  uint type_rgba_size [4];
  uint internalformat_rgba_size [4];
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38 [4];
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_48 = 0;
  uStack_40 = 0;
  getComponentSizeForInternalformat(internalformat,local_38);
  getComponentSizeForType(type,(uint *)&local_48);
  if (local_38[0] == 0) {
    local_48 = local_48 & 0xffffffff00000000;
  }
  if (local_38[1] == 0) {
    local_48 = local_48 & 0xffffffff;
  }
  if (local_38[2] == 0) {
    uStack_40 = uStack_40 & 0xffffffff00000000;
  }
  if (local_38[3] == 0) {
    uStack_40 = uStack_40 & 0xffffffff;
  }
  return height * width * (local_48._4_4_ + (uint)local_48 + (int)uStack_40 + uStack_40._4_4_ >> 3);
}

Assistant:

unsigned int TextureViewUtilities::getTextureDataSize(const glw::GLenum internalformat, const glw::GLenum type,
													  const unsigned int width, const unsigned int height)
{
	unsigned int internalformat_rgba_size[4] = { 0 };
	unsigned int type_rgba_size[4]			 = { 0 };
	unsigned int texel_size					 = 0;

	TextureViewUtilities::getComponentSizeForInternalformat(internalformat, internalformat_rgba_size);
	TextureViewUtilities::getComponentSizeForType(type, type_rgba_size);

	if (internalformat_rgba_size[0] == 0)
	{
		type_rgba_size[0] = 0;
	}

	if (internalformat_rgba_size[1] == 0)
	{
		type_rgba_size[1] = 0;
	}

	if (internalformat_rgba_size[2] == 0)
	{
		type_rgba_size[2] = 0;
	}

	if (internalformat_rgba_size[3] == 0)
	{
		type_rgba_size[3] = 0;
	}

	texel_size = type_rgba_size[0] + type_rgba_size[1] + type_rgba_size[2] + type_rgba_size[3];

	/* Current implementation assumes we do not need to use bit resolution when
	 * preparing texel data. Make extra sure we're not wrong. */
	DE_ASSERT((texel_size % 8) == 0);

	texel_size /= 8; /* bits per byte */

	return texel_size * width * height;
}